

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O1

void __thiscall
duckdb::DuckTableEntry::UndoAlter(DuckTableEntry *this,ClientContext *context,AlterInfo *info)

{
  pointer pcVar1;
  DataTable *this_00;
  string local_38;
  
  if (info->field_0x71 == '\x02') {
    this_00 = shared_ptr<duckdb::DataTable,_true>::operator->(&this->storage);
    pcVar1 = (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
             super_CatalogEntry.name._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,
               pcVar1 + (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                        super_CatalogEntry.name._M_string_length);
    DataTable::SetTableName(this_00,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void DuckTableEntry::UndoAlter(ClientContext &context, AlterInfo &info) {
	D_ASSERT(!internal);
	D_ASSERT(info.type == AlterType::ALTER_TABLE);
	auto &table_info = info.Cast<AlterTableInfo>();
	switch (table_info.alter_table_type) {
	case AlterTableType::RENAME_TABLE: {
		storage->SetTableName(this->name);
		break;
	default:
		break;
	}
	}
}